

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *
testing::internal::ActionResultHolder<std::optional<n_e_s::core::Pixel>>::
PerformAction<std::optional<n_e_s::core::Pixel>()>
          (Action<std::optional<n_e_s::core::Pixel>_()> *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *pAVar2;
  
  pAVar2 = (ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *)operator_new(0x10);
  RVar1 = Action<std::optional<n_e_s::core::Pixel>_()>::Perform(action);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002ad808;
  *(int *)&(pAVar2->result_).value_.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload =
       RVar1.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
       super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_;
  *(short *)((long)&(pAVar2->result_).value_.super__Optional_base<n_e_s::core::Pixel,_true,_true>.
                    _M_payload.super__Optional_payload_base<n_e_s::core::Pixel>._M_payload + 4) =
       RVar1.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
       super__Optional_payload_base<n_e_s::core::Pixel>._4_2_;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }